

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::MultiPartInputFile::initialize(MultiPartInputFile *this)

{
  _Base_ptr p_Var1;
  uint uVar2;
  bool bVar3;
  Data *pDVar4;
  string *psVar5;
  iterator iVar6;
  Data *pDVar7;
  InputPartData *this_00;
  ArgExc *this_01;
  InputExc *pIVar8;
  long *plVar9;
  size_type *psVar10;
  long lVar11;
  char *text;
  pointer_____offset_0x10___ *ppuVar12;
  Data *this_02;
  long lVar13;
  ulong uVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attrs;
  Header header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 local_90 [32];
  _Base_ptr local_70;
  size_t local_68;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GenericInputFile::readMagicNumberAndVersionField
            (&this->super_GenericInputFile,(this->_data->super_InputStreamMutex).is,
             &this->_data->version);
  uVar2 = this->_data->version;
  if ((~uVar2 & 0x1200) == 0) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc((InputExc *)this_01,"Multipart files cannot have the tiled bit set")
    ;
    ppuVar12 = &Iex_2_5::InputExc::typeinfo;
LAB_00159006:
    __cxa_throw(this_01,ppuVar12,Iex_2_5::TypeExc::~TypeExc);
  }
  do {
    local_e8._M_dataplus._M_p = (pointer)0x0;
    Header::Header((Header *)local_90,0x40,0x40,1.0,(V2f *)&local_e8,1.0,INCREASING_Y,
                   ZIP_COMPRESSION);
    Header::readFrom((Header *)local_90,(this->_data->super_InputStreamMutex).is,
                     &this->_data->version);
    bVar3 = Header::readsNothing((Header *)local_90);
    if (bVar3) {
      Header::~Header((Header *)local_90);
      break;
    }
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
              (&this->_data->_headers,(Header *)local_90);
    Header::~Header((Header *)local_90);
  } while ((uVar2 >> 0xc & 1) != 0);
  pDVar4 = this->_data;
  this_02 = (Data *)(pDVar4->_headers).
                    super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
                    super__Vector_impl_data._M_start;
  pDVar7 = (Data *)(pDVar4->_headers).
                   super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  if (pDVar7 != this_02) {
    local_58 = (string *)TILEDIMAGE_abi_cxx11_;
    if ((uVar2 >> 9 & 1) == 0) {
      local_58 = (string *)SCANLINEIMAGE_abi_cxx11_;
    }
    lVar13 = 0;
    uVar14 = 0;
    do {
      bVar3 = Header::hasType((Header *)
                              (&(((_Rep_type *)&(this_02->super_InputStreamMutex).super_Mutex)->
                                _M_impl).field_0x0 + lVar13));
      if (!bVar3) {
        if ((uVar2 >> 0xc & 1) == 0) {
          pDVar4 = this->_data;
          goto LAB_00158d2a;
        }
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        text = "Every header in a multipart file should have a type";
LAB_00158ff0:
        Iex_2_5::ArgExc::ArgExc(this_01,text);
        ppuVar12 = &Iex_2_5::ArgExc::typeinfo;
        goto LAB_00159006;
      }
      if (((uVar2 >> 0xc & 1) == 0) && (pDVar4 = this->_data, (pDVar4->version & 0x800) == 0)) {
LAB_00158d2a:
        Header::setType((Header *)
                        ((long)&(((pDVar4->_headers).
                                  super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                        lVar13),local_58);
      }
      bVar3 = Header::hasName((Header *)
                              ((long)&(((this->_data->_headers).
                                        super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                      _M_impl + lVar13));
      if (!bVar3 && (uVar2 >> 0xc & 1) != 0) {
        this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
        text = "Every header in a multipart file should have a name";
        goto LAB_00158ff0;
      }
      psVar5 = Header::type_abi_cxx11_
                         ((Header *)
                          ((long)&(((this->_data->_headers).
                                    super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                          lVar13));
      bVar3 = isTiled(psVar5);
      Header::sanityCheck((Header *)
                          ((long)&(((this->_data->_headers).
                                    super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                          lVar13),bVar3,(bool)((byte)(uVar2 >> 0xc) & 1));
      uVar14 = uVar14 + 1;
      pDVar4 = this->_data;
      this_02 = (Data *)(pDVar4->_headers).
                        super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      pDVar7 = (Data *)(pDVar4->_headers).
                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl
                       .super__Vector_impl_data._M_finish;
      lVar13 = lVar13 + 0x38;
    } while (uVar14 < (ulong)(((long)pDVar7 - (long)this_02 >> 3) * 0x6db6db6db6db6db7));
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    p_Var1 = (_Base_ptr)(local_90 + 8);
    local_90._8_8_ = local_90._8_8_ & 0xffffffff00000000;
    local_90._16_8_ = (_Base_ptr)0x0;
    local_68 = 0;
    local_90._24_8_ = p_Var1;
    local_70 = p_Var1;
    if (pDVar7 != this_02) {
      lVar13 = 0;
      uVar14 = 0;
      do {
        psVar5 = Header::name_abi_cxx11_
                           ((Header *)
                            (&(((_Rep_type *)&(this_02->super_InputStreamMutex).super_Mutex)->
                              _M_impl).field_0x0 + lVar13));
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_90,psVar5);
        if (iVar6._M_node != p_Var1) {
          pIVar8 = (InputExc *)__cxa_allocate_exception(0x48);
          psVar5 = Header::name_abi_cxx11_
                             ((Header *)
                              ((long)&(((this->_data->_headers).
                                        super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                      _M_impl + lVar13));
          std::operator+(&local_c8,"Header name ",psVar5);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_c8);
          local_e8._M_dataplus._M_p = (pointer)*plVar9;
          psVar10 = (size_type *)(plVar9 + 2);
          if ((size_type *)local_e8._M_dataplus._M_p == psVar10) {
            local_e8.field_2._M_allocated_capacity = *psVar10;
            local_e8.field_2._8_8_ = plVar9[3];
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar10;
          }
          local_e8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          Iex_2_5::InputExc::InputExc(pIVar8,&local_e8);
          __cxa_throw(pIVar8,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        psVar5 = Header::name_abi_cxx11_
                           ((Header *)
                            ((long)&(((this->_data->_headers).
                                      super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl
                            + lVar13));
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_90,psVar5);
        uVar14 = uVar14 + 1;
        this_02 = (Data *)(this->_data->_headers).
                          super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        lVar13 = lVar13 + 0x38;
      } while (uVar14 < (ulong)(((long)(this->_data->_headers).
                                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)this_02 >>
                                3) * 0x6db6db6db6db6db7));
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_90);
    pDVar4 = this->_data;
    this_02 = (Data *)(pDVar4->_headers).
                      super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
                      super__Vector_impl_data._M_start;
    pDVar7 = (Data *)(pDVar4->_headers).
                     super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    if (1 < (ulong)(((long)pDVar7 - (long)this_02 >> 3) * 0x6db6db6db6db6db7)) {
      uVar14 = 1;
      lVar13 = 0x38;
      do {
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar3 = Data::checkSharedAttributesValues
                          (this_02,(Header *)this_02,
                           (Header *)
                           ((long)&(this_02->super_InputStreamMutex).super_Mutex.super___mutex_base.
                                   _M_mutex + lVar13),&local_a8);
        if (bVar3) {
          local_90._0_8_ = local_90 + 0x10;
          local_90._8_8_ = 0;
          local_90._16_8_ = local_90._16_8_ & 0xffffffffffffff00;
          if (local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar11 = 0;
            uVar14 = 0;
            do {
              std::operator+(&local_e8," ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&((local_a8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar11));
              std::__cxx11::string::_M_append(local_90,(ulong)local_e8._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              uVar14 = uVar14 + 1;
              lVar11 = lVar11 + 0x20;
            } while (uVar14 < (ulong)((long)local_a8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_a8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          pIVar8 = (InputExc *)__cxa_allocate_exception(0x48);
          psVar5 = Header::name_abi_cxx11_
                             ((Header *)
                              ((long)&(((this->_data->_headers).
                                        super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t.
                                      _M_impl + lVar13));
          std::operator+(&local_50,"Header name ",psVar5);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_c8._M_dataplus._M_p = (pointer)*plVar9;
          psVar10 = (size_type *)(plVar9 + 2);
          if ((size_type *)local_c8._M_dataplus._M_p == psVar10) {
            local_c8.field_2._M_allocated_capacity = *psVar10;
            local_c8.field_2._8_8_ = plVar9[3];
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar10;
          }
          local_c8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::operator+(&local_e8,&local_c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90);
          Iex_2_5::InputExc::InputExc(pIVar8,&local_e8);
          __cxa_throw(pIVar8,&Iex_2_5::InputExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8);
        uVar14 = uVar14 + 1;
        pDVar4 = this->_data;
        this_02 = (Data *)(pDVar4->_headers).
                          super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        pDVar7 = (Data *)(pDVar4->_headers).
                         super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
        lVar13 = lVar13 + 0x38;
      } while (uVar14 < (ulong)(((long)pDVar7 - (long)this_02 >> 3) * 0x6db6db6db6db6db7));
    }
  }
  if (pDVar7 != this_02) {
    lVar13 = 0;
    uVar14 = 0;
    do {
      this_00 = (InputPartData *)operator_new(0x70);
      InputPartData::InputPartData
                (this_00,&pDVar4->super_InputStreamMutex,
                 (Header *)
                 ((long)&(((pDVar4->_headers).
                           super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl + lVar13),
                 (int)uVar14,pDVar4->numThreads,pDVar4->version);
      local_90._0_8_ = this_00;
      std::vector<Imf_2_5::InputPartData*,std::allocator<Imf_2_5::InputPartData*>>::
      emplace_back<Imf_2_5::InputPartData*>
                ((vector<Imf_2_5::InputPartData*,std::allocator<Imf_2_5::InputPartData*>> *)
                 &pDVar4->parts,(InputPartData **)local_90);
      uVar14 = uVar14 + 1;
      pDVar4 = this->_data;
      lVar13 = lVar13 + 0x38;
    } while (uVar14 < (ulong)(((long)(pDVar4->_headers).
                                     super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pDVar4->_headers).
                                     super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  Data::readChunkOffsetTables(pDVar4,pDVar4->reconstructChunkOffsetTable);
  return;
}

Assistant:

void
MultiPartInputFile::initialize()
{
    readMagicNumberAndVersionField(*_data->is, _data->version);
    
    bool multipart = isMultiPart(_data->version);
    bool tiled = isTiled(_data->version);

    //
    // Multipart files don't have and shouldn't have the tiled bit set.
    //

    if (tiled && multipart)
        throw IEX_NAMESPACE::InputExc ("Multipart files cannot have the tiled bit set");

    
    int pos = 0;
    while (true)
    {
        Header header;
        header.readFrom(*_data->is, _data->version);

        //
        // If we read nothing then we stop reading.
        //

        if (header.readsNothing())
        {
            pos++;
            break;
        }

        _data->_headers.push_back(header);
        
        if(multipart == false)
          break;
    }

    //
    // Perform usual check on headers.
    //

    for (size_t i = 0; i < _data->_headers.size(); i++)
    {
        //
        // Silently invent a type if the file is a single part regular image.
        //

        if( _data->_headers[i].hasType() == false )
        {
            if(multipart)

                throw IEX_NAMESPACE::ArgExc ("Every header in a multipart file should have a type");
          
            _data->_headers[i].setType(tiled ? TILEDIMAGE : SCANLINEIMAGE);
        }
        else
        {
            
            //
            // Silently fix the header type if it's wrong
            // (happens when a regular Image file written by EXR_2.0 is rewritten by an older library,
            //  so doesn't effect deep image types)
            //

            if(!multipart && !isNonImage(_data->version))
            {
                _data->_headers[i].setType(tiled ? TILEDIMAGE : SCANLINEIMAGE);
            }
        }
         

        
        if( _data->_headers[i].hasName() == false )
        {
            if(multipart)
                throw IEX_NAMESPACE::ArgExc ("Every header in a multipart file should have a name");
        }
        
        if (isTiled(_data->_headers[i].type()))
            _data->_headers[i].sanityCheck(true, multipart);
        else
            _data->_headers[i].sanityCheck(false, multipart);
    }

    //
    // Check name uniqueness.
    //

    if (multipart)
    {
        set<string> names;
        for (size_t i = 0; i < _data->_headers.size(); i++)
        {
        
            if (names.find(_data->_headers[i].name()) != names.end())
            {
                throw IEX_NAMESPACE::InputExc ("Header name " + _data->_headers[i].name() +
                                   " is not a unique name.");
            }
            names.insert(_data->_headers[i].name());
        }
    }
    
    //
    // Check shared attributes compliance.
    //

    if (multipart && strictSharedAttribute)
    {
        for (size_t i = 1; i < _data->_headers.size(); i++)
        {
            vector <string> attrs;
            if (_data->checkSharedAttributesValues (_data->_headers[0], _data->_headers[i], attrs))
            {
                string attrNames;
                for (size_t j=0; j<attrs.size(); j++)
                    attrNames += " " + attrs[j];
                throw IEX_NAMESPACE::InputExc ("Header name " + _data->_headers[i].name() +
                                     " has non-conforming shared attributes: "+
                                     attrNames);
            }
        }
    }

    //
    // Create InputParts and read chunk offset tables.
    //
        
    for (size_t i = 0; i < _data->_headers.size(); i++)
        _data->parts.push_back(
                new InputPartData(_data, _data->_headers[i], i, _data->numThreads, _data->version));

    _data->readChunkOffsetTables(_data->reconstructChunkOffsetTable);
}